

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

bool __thiscall CInput::MouseRelative(CInput *this,float *pX,float *pY)

{
  bool bVar1;
  long in_FS_OFFSET;
  int MouseY;
  int MouseX;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  if (this->m_MouseInputRelative == true) {
    local_2c = 0;
    local_30 = 0;
    SDL_GetRelativeMouseState(&local_2c,&local_30);
    bVar1 = local_2c != 0 || local_30 != 0;
    if (local_2c != 0 || local_30 != 0) {
      *pX = (float)local_2c;
      *pY = (float)local_30;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool CInput::MouseRelative(float *pX, float *pY)
{
	if(!m_MouseInputRelative)
		return false;

	int MouseX = 0, MouseY = 0;
	SDL_GetRelativeMouseState(&MouseX, &MouseY);
	if(MouseX || MouseY)
	{
		*pX = MouseX;
		*pY = MouseY;
		return true;
	}
	return false;
}